

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utGenNormals.cpp
# Opt level: O1

void __thiscall GenNormalsTest::SetUp(GenNormalsTest *this)

{
  GenVertexNormalsProcess *this_00;
  aiMesh *paVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  aiVector3D *paVar4;
  
  this_00 = (GenVertexNormalsProcess *)operator_new(0x20);
  Assimp::GenVertexNormalsProcess::GenVertexNormalsProcess(this_00);
  this->piProcess = this_00;
  paVar1 = (aiMesh *)operator_new(0x520);
  paVar1->mPrimitiveTypes = 0;
  paVar1->mNumVertices = 0;
  paVar1->mNumFaces = 0;
  memset(&paVar1->mVertices,0,0xcc);
  paVar1->mBones = (aiBone **)0x0;
  paVar1->mMaterialIndex = 0;
  (paVar1->mName).length = 0;
  (paVar1->mName).data[0] = '\0';
  memset((paVar1->mName).data + 1,0x1b,0x3ff);
  paVar1->mNumAnimMeshes = 0;
  paVar1->mAnimMeshes = (aiAnimMesh **)0x0;
  paVar1->mMethod = 0;
  (paVar1->mAABB).mMin.x = 0.0;
  (paVar1->mAABB).mMin.y = 0.0;
  (paVar1->mAABB).mMin.z = 0.0;
  (paVar1->mAABB).mMax.x = 0.0;
  (paVar1->mAABB).mMax.y = 0.0;
  (paVar1->mAABB).mMax.z = 0.0;
  paVar1->mTextureCoords[0] = (aiVector3D *)0x0;
  paVar1->mTextureCoords[1] = (aiVector3D *)0x0;
  paVar1->mTextureCoords[2] = (aiVector3D *)0x0;
  paVar1->mTextureCoords[3] = (aiVector3D *)0x0;
  paVar1->mTextureCoords[4] = (aiVector3D *)0x0;
  paVar1->mTextureCoords[5] = (aiVector3D *)0x0;
  paVar1->mTextureCoords[6] = (aiVector3D *)0x0;
  paVar1->mTextureCoords[7] = (aiVector3D *)0x0;
  paVar1->mNumUVComponents[0] = 0;
  paVar1->mNumUVComponents[1] = 0;
  paVar1->mNumUVComponents[2] = 0;
  paVar1->mNumUVComponents[3] = 0;
  paVar1->mNumUVComponents[4] = 0;
  paVar1->mNumUVComponents[5] = 0;
  paVar1->mNumUVComponents[6] = 0;
  paVar1->mNumUVComponents[7] = 0;
  paVar1->mColors[0] = (aiColor4D *)0x0;
  paVar1->mColors[1] = (aiColor4D *)0x0;
  paVar1->mColors[2] = (aiColor4D *)0x0;
  paVar1->mColors[3] = (aiColor4D *)0x0;
  paVar1->mColors[4] = (aiColor4D *)0x0;
  paVar1->mColors[5] = (aiColor4D *)0x0;
  paVar1->mColors[6] = (aiColor4D *)0x0;
  paVar1->mColors[7] = (aiColor4D *)0x0;
  this->pcMesh = paVar1;
  paVar1->mPrimitiveTypes = 4;
  paVar1->mNumFaces = 1;
  puVar2 = (undefined8 *)operator_new__(0x18);
  *puVar2 = 1;
  *(undefined4 *)(puVar2 + 1) = 0;
  puVar2[2] = 0;
  paVar1->mFaces = (aiFace *)(puVar2 + 1);
  *(undefined4 *)(puVar2 + 1) = 3;
  puVar3 = (undefined8 *)operator_new__(0xc);
  puVar2[2] = puVar3;
  *puVar3 = 0x100000000;
  *(undefined4 *)(puVar3 + 1) = 1;
  paVar1->mNumVertices = 3;
  paVar4 = (aiVector3D *)operator_new__(0x24);
  paVar4->x = 0.0;
  paVar4->y = 0.0;
  *(undefined8 *)&paVar4->z = 0;
  paVar4[1].y = 0.0;
  paVar4[1].z = 0.0;
  paVar4[2].x = 0.0;
  paVar4[2].y = 0.0;
  paVar4[2].z = 0.0;
  paVar1->mVertices = paVar4;
  paVar4->x = 0.0;
  paVar4->y = 1.0;
  *(undefined8 *)&paVar4->z = 0x4000000040c00000;
  paVar4[1].y = 3.0;
  paVar4[1].z = 1.0;
  paVar4[2].x = 3.0;
  paVar4[2].y = 2.0;
  paVar4[2].z = 4.0;
  return;
}

Assistant:

void GenNormalsTest::SetUp()
{
    piProcess = new GenVertexNormalsProcess();
    pcMesh = new aiMesh();
    pcMesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;
    pcMesh->mNumFaces = 1;
    pcMesh->mFaces = new aiFace[1];
    pcMesh->mFaces[0].mIndices = new unsigned int[pcMesh->mFaces[0].mNumIndices = 3];
    pcMesh->mFaces[0].mIndices[0] = 0;
    pcMesh->mFaces[0].mIndices[1] = 1;
    pcMesh->mFaces[0].mIndices[2] = 1;
    pcMesh->mNumVertices = 3;
    pcMesh->mVertices = new aiVector3D[3];
    pcMesh->mVertices[0] = aiVector3D(0.0f,1.0f,6.0f);
    pcMesh->mVertices[1] = aiVector3D(2.0f,3.0f,1.0f);
    pcMesh->mVertices[2] = aiVector3D(3.0f,2.0f,4.0f);
}